

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageFill(gdImagePtr im,int x,int y,int nc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int y_00;
  int iVar7;
  int iVar8;
  int *ptr;
  int *piVar9;
  bool bVar10;
  int local_58;
  int c;
  int iy;
  int ix;
  seg *sp;
  seg *stack;
  int alphablending_bak;
  int wy2;
  int wx2;
  int oc;
  int dy;
  int x2;
  int x1;
  int l;
  int nc_local;
  int y_local;
  int x_local;
  gdImagePtr im_local;
  
  if ((im->trueColor != 0) || (nc <= im->colorsTotal + -1)) {
    iVar1 = im->alphaBlendingFlag;
    im->alphaBlendingFlag = 0;
    if (nc == -5) {
      _gdImageFillTiled(im,x,y,-5);
      im->alphaBlendingFlag = iVar1;
    }
    else {
      iVar5 = im->sx;
      iVar2 = im->sy;
      iVar4 = gdImageGetPixel(im,x,y);
      if ((((iVar4 == nc) || (x < 0)) || (iVar5 < x)) || ((y < 0 || (iVar2 < y)))) {
        im->alphaBlendingFlag = iVar1;
      }
      else {
        c = x;
        local_58 = y;
        if (im->sx < 4) {
          do {
            iVar5 = gdImageGetPixel(im,c,local_58);
            if (iVar5 != iVar4) break;
            gdImageSetPixel(im,c,local_58,nc);
            bVar10 = c < im->sx + -1;
            c = c + 1;
          } while ((bVar10) ||
                  (bVar10 = local_58 < im->sy + -1, c = x, local_58 = local_58 + 1, bVar10));
        }
        else {
          iVar6 = overflow2(im->sy,im->sx);
          if (iVar6 != 0) {
            return;
          }
          iVar6 = overflow2(0x10,(im->sy * im->sx) / 4);
          if (iVar6 != 0) {
            return;
          }
          ptr = (int *)gdMalloc((long)((im->sy * im->sx) / 4) << 4);
          if (ptr == (int *)0x0) {
            return;
          }
          _iy = ptr;
          if (((ptr < ptr + (long)((im->sy * im->sx) / 4) * 4) && (-1 < y + 1)) && (y + 1 < iVar2))
          {
            *ptr = y;
            ptr[1] = x;
            ptr[2] = x;
            ptr[3] = 1;
            _iy = ptr + 4;
          }
          if (((_iy < ptr + (long)((im->sy * im->sx) / 4) * 4) && (-1 < y)) && (y < iVar2)) {
            *_iy = y + 1;
            _iy[1] = x;
            _iy[2] = x;
            _iy[3] = -1;
            _iy = _iy + 4;
          }
          while (ptr < _iy) {
            piVar9 = _iy + -4;
            iVar6 = _iy[-1];
            y_00 = *piVar9 + iVar6;
            iVar8 = _iy[-3];
            iVar3 = _iy[-2];
            nc_local = iVar8;
            while( true ) {
              bVar10 = false;
              if (-1 < nc_local) {
                iVar7 = gdImageGetPixel(im,nc_local,y_00);
                bVar10 = iVar7 == iVar4;
              }
              if (!bVar10) break;
              gdImageSetPixel(im,nc_local,y_00,nc);
              nc_local = nc_local + -1;
            }
            if (nc_local < iVar8) {
              x2 = nc_local + 1;
              if (((x2 < iVar8) && (piVar9 < ptr + (long)((im->sy * im->sx) / 4) * 4)) &&
                 ((-1 < y_00 - iVar6 && (y_00 - iVar6 < iVar2)))) {
                *piVar9 = y_00;
                _iy[-3] = x2;
                _iy[-2] = iVar8 + -1;
                _iy[-1] = -iVar6;
                piVar9 = _iy;
              }
              _iy = piVar9;
              nc_local = iVar8 + 1;
              goto LAB_001104a5;
            }
            while( true ) {
              do {
                _iy = piVar9;
                nc_local = nc_local + 1;
                bVar10 = false;
                if (nc_local <= iVar3) {
                  iVar8 = gdImageGetPixel(im,nc_local,y_00);
                  bVar10 = iVar8 != iVar4;
                }
                piVar9 = _iy;
              } while (bVar10);
              x2 = nc_local;
              if (iVar3 < nc_local) break;
LAB_001104a5:
              while( true ) {
                bVar10 = false;
                if (nc_local <= iVar5) {
                  iVar8 = gdImageGetPixel(im,nc_local,y_00);
                  bVar10 = iVar8 == iVar4;
                }
                if (!bVar10) break;
                gdImageSetPixel(im,nc_local,y_00,nc);
                nc_local = nc_local + 1;
              }
              if (((_iy < ptr + (long)((im->sy * im->sx) / 4) * 4) && (-1 < y_00 + iVar6)) &&
                 (y_00 + iVar6 < iVar2)) {
                *_iy = y_00;
                _iy[1] = x2;
                _iy[2] = nc_local + -1;
                _iy[3] = iVar6;
                _iy = _iy + 4;
              }
              piVar9 = _iy;
              if ((((iVar3 + 1 < nc_local) && (_iy < ptr + (long)((im->sy * im->sx) / 4) * 4)) &&
                  (-1 < y_00 - iVar6)) && (y_00 - iVar6 < iVar2)) {
                *_iy = y_00;
                _iy[1] = iVar3 + 1;
                _iy[2] = nc_local + -1;
                _iy[3] = -iVar6;
                piVar9 = _iy + 4;
              }
            }
          }
          gdFree(ptr);
        }
        im->alphaBlendingFlag = iVar1;
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFill(gdImagePtr im, int x, int y, int nc)
{
	int l, x1, x2, dy;
	int oc;   /* old pixel value */
	int wx2,wy2;

	int alphablending_bak;

	/* stack of filled segments */
	/* struct seg stack[FILL_MAX],*sp = stack; */
	struct seg *stack;
	struct seg *sp;

	if (!im->trueColor && nc > (im->colorsTotal - 1)) {
		return;
	}

	alphablending_bak = im->alphaBlendingFlag;
	im->alphaBlendingFlag = 0;

	if (nc==gdTiled) {
		_gdImageFillTiled(im,x,y,nc);
		im->alphaBlendingFlag = alphablending_bak;
		return;
	}

	wx2=im->sx;
	wy2=im->sy;
	oc = gdImageGetPixel(im, x, y);
	if (oc==nc || x<0 || x>wx2 || y<0 || y>wy2) {
		im->alphaBlendingFlag = alphablending_bak;
		return;
	}

	/* Do not use the 4 neighbors implementation with
	* small images
	*/
	if (im->sx < 4) {
		int ix = x, iy = y, c;
		do {
			do {
				c = gdImageGetPixel(im, ix, iy);
				if (c != oc) {
					goto done;
				}
				gdImageSetPixel(im, ix, iy, nc);
			} while(ix++ < (im->sx -1));
			ix = x;
		} while(iy++ < (im->sy -1));
		goto done;
	}

	if(overflow2(im->sy, im->sx)) {
		return;
	}

	if(overflow2(sizeof(struct seg), ((im->sy * im->sx) / 4))) {
		return;
	}

	stack = (struct seg *)gdMalloc(sizeof(struct seg) * ((int)(im->sy*im->sx)/4));
	if (!stack) {
		return;
	}
	sp = stack;

	/* required! */
	FILL_PUSH(y,x,x,1);
	/* seed segment (popped 1st) */
	FILL_PUSH(y+1, x, x, -1);
	while (sp>stack) {
		FILL_POP(y, x1, x2, dy);

		for (x=x1; x>=0 && gdImageGetPixel(im,x, y)==oc; x--) {
			gdImageSetPixel(im,x, y, nc);
		}
		if (x>=x1) {
			goto skip;
		}
		l = x+1;

		/* leak on left? */
		if (l<x1) {
			FILL_PUSH(y, l, x1-1, -dy);
		}
		x = x1+1;
		do {
			for (; x<=wx2 && gdImageGetPixel(im,x, y)==oc; x++) {
				gdImageSetPixel(im, x, y, nc);
			}
			FILL_PUSH(y, l, x-1, dy);
			/* leak on right? */
			if (x>x2+1) {
				FILL_PUSH(y, x2+1, x-1, -dy);
			}
skip:
			for (x++; x<=x2 && (gdImageGetPixel(im, x, y)!=oc); x++);

			l = x;
		} while (x<=x2);
	}

	gdFree(stack);

done:
	im->alphaBlendingFlag = alphablending_bak;
}